

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::CreateExtensionRegex
          (string *__return_storage_ptr__,cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *exts,LinkType type)

{
  bool bVar1;
  reference pbVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator i;
  char *sep;
  allocator local_26;
  undefined1 local_25;
  LinkType local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  LinkType type_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *exts_local;
  cmComputeLinkInformation *this_local;
  string *libext;
  
  local_25 = 0;
  local_24 = type;
  pvStack_20 = exts;
  exts_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  this_local = (cmComputeLinkInformation *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"(",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa6057c;
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(pvStack_20);
  while( true ) {
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvStack_20);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)i._M_current);
    i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa58cdb;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\");
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_48);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar2);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  if ((this->OpenBSD & 1U) == 0) {
    if (local_24 == LinkShared) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(\\.[0-9]+)?");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(\\.[0-9]+\\.[0-9]+)?");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$");
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::CreateExtensionRegex(
  std::vector<std::string> const& exts, LinkType type)
{
  // Build a list of extension choices.
  std::string libext = "(";
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = exts.begin();
       i != exts.end(); ++i) {
    // Separate this choice from the previous one.
    libext += sep;
    sep = "|";

    // Store this extension choice with the "." escaped.
    libext += "\\";
#if defined(_WIN32) && !defined(__CYGWIN__)
    libext += this->NoCaseExpression(i->c_str());
#else
    libext += *i;
#endif
  }

  // Finish the list.
  libext += ")";

  // Add an optional OpenBSD version component.
  if (this->OpenBSD) {
    libext += "(\\.[0-9]+\\.[0-9]+)?";
  } else if (type == LinkShared) {
    libext += "(\\.[0-9]+)?";
  }

  libext += "$";
  return libext;
}